

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O0

int vkt::tessellation::numOuterTessellationLevels(TessPrimitiveType primType)

{
  undefined4 local_c;
  TessPrimitiveType primType_local;
  
  if (primType == TESSPRIMITIVETYPE_TRIANGLES) {
    local_c = 3;
  }
  else if (primType == TESSPRIMITIVETYPE_QUADS) {
    local_c = 4;
  }
  else if (primType == TESSPRIMITIVETYPE_ISOLINES) {
    local_c = 2;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

int numOuterTessellationLevels (const TessPrimitiveType primType)
{
	switch (primType)
	{
		case TESSPRIMITIVETYPE_TRIANGLES:	return 3;
		case TESSPRIMITIVETYPE_QUADS:		return 4;
		case TESSPRIMITIVETYPE_ISOLINES:	return 2;
		default:
			DE_ASSERT(false);
			return 0;
	}
}